

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_decoder.c
# Opt level: O0

lzma_ret lzma_simple_props_decode
                   (void **options,lzma_allocator *allocator,uint8_t *props,size_t props_size)

{
  uint32_t uVar1;
  uint32_t *ptr;
  lzma_options_bcj *opt;
  size_t props_size_local;
  uint8_t *props_local;
  lzma_allocator *allocator_local;
  void **options_local;
  
  if (props_size == 0) {
    options_local._4_4_ = LZMA_OK;
  }
  else if (props_size == 4) {
    ptr = (uint32_t *)lzma_alloc(4,allocator);
    if (ptr == (uint32_t *)0x0) {
      options_local._4_4_ = LZMA_MEM_ERROR;
    }
    else {
      uVar1 = read32le(props);
      *ptr = uVar1;
      if (*ptr == 0) {
        lzma_free(ptr,allocator);
      }
      else {
        *options = ptr;
      }
      options_local._4_4_ = LZMA_OK;
    }
  }
  else {
    options_local._4_4_ = LZMA_OPTIONS_ERROR;
  }
  return options_local._4_4_;
}

Assistant:

extern lzma_ret
lzma_simple_props_decode(void **options, const lzma_allocator *allocator,
		const uint8_t *props, size_t props_size)
{
	if (props_size == 0)
		return LZMA_OK;

	if (props_size != 4)
		return LZMA_OPTIONS_ERROR;

	lzma_options_bcj *opt = lzma_alloc(
			sizeof(lzma_options_bcj), allocator);
	if (opt == NULL)
		return LZMA_MEM_ERROR;

	opt->start_offset = read32le(props);

	// Don't leave an options structure allocated if start_offset is zero.
	if (opt->start_offset == 0)
		lzma_free(opt, allocator);
	else
		*options = opt;

	return LZMA_OK;
}